

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4799b::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody
          (BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test *this)

{
  pointer pbVar1;
  pointer pbVar2;
  Child CVar3;
  Child CVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  undefined8 *puVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Child CVar13;
  pointer *__ptr;
  char cVar14;
  long *plVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *in_R9;
  pointer pcVar16;
  Child CVar17;
  long lVar18;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef path;
  StringRef mainFilename;
  StringRef Filename_00;
  StringRef Str_00;
  StringRef path_00;
  StringRef mainFilename_00;
  StringRef str;
  BuildSystem system;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  string linkFileList;
  Optional<llbuild::buildsystem::BuildValue> result;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  SmallString<256U> manifest;
  SmallString<256U> builddb;
  TmpDir tempDir;
  undefined1 local_5a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  BuildSystem local_588;
  AssertHelper local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_570;
  Child local_558;
  Child local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  undefined1 local_528 [16];
  long *local_518 [2];
  long local_508 [2];
  Child local_4f8;
  size_t local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  Child local_4d8;
  long local_4d0;
  anon_union_80_2_ecfed234_for_valueData local_4c8;
  char local_468;
  Child local_460;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_458;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_450;
  BuildKey local_448;
  Child local_428;
  long local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8 [2];
  ExecutionQueueDelegate local_3b8 [2];
  AssertHelper local_3a8;
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  SmallVectorImpl<char> local_360;
  undefined1 local_350 [256];
  Child local_250;
  long local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240 [16];
  TmpDir local_140;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_250,&local_140);
  local_360.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_350;
  local_360.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_360.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_360,local_250.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_250.twine)->LHS)->_M_local_buf + local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.twine != local_240) {
    operator_delete(local_250.twine,local_240[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_250,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&local_428,"");
  llvm::Twine::Twine((Twine *)&local_4d8,"");
  llvm::Twine::Twine((Twine *)&local_558,"");
  llvm::sys::path::append
            (&local_360,(Twine *)&local_250,(Twine *)&local_428,(Twine *)&local_4d8,
             (Twine *)&local_558);
  local_428.twine = (Twine *)((ulong)(uint)local_428._4_4_ << 0x20);
  lVar7 = std::_V2::system_category();
  Filename.Length._0_4_ =
       local_360.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Filename.Data =
       (char *)local_360.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  Filename.Length._4_4_ = 0;
  local_420 = lVar7;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_250,Filename,(error_code *)&local_428,F_Text);
  if (local_428.decUI != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x388,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                 );
  }
  Str.Length = 0xf12;
  Str.Data = 
  "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Hea..." /* TRUNCATED STRING LITERAL */
  ;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_250,Str);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_250);
  str.Length = 3;
  str.Data = "C.1";
  llbuild::buildsystem::BuildKey::BuildKey(&local_448,'C',str);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_428,&local_140);
  local_250.twine = (Twine *)local_240;
  local_248 = 0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_250,local_428.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_428.twine)->LHS)->_M_local_buf + local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.twine != local_418) {
    operator_delete(local_428.twine,local_418[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_428,"build.db");
  pcVar16 = "";
  llvm::Twine::Twine((Twine *)&local_4d8,"");
  llvm::Twine::Twine((Twine *)&local_558,"");
  llvm::Twine::Twine((Twine *)&local_4f8,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_250,(Twine *)&local_428,(Twine *)&local_4d8,
             (Twine *)&local_558,(Twine *)&local_4f8);
  local_4f8.twine = (Twine *)&local_4e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,
             "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList"
             ,"");
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&local_428,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&local_588,(BuildSystemDelegate *)&local_428,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_450);
  if (local_450._M_head_impl != (FileSystem *)0x0) {
    (*(local_450._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_450._M_head_impl = (FileSystem *)0x0;
  pcVar8 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_250);
  if (pcVar8 == (char *)0x0) {
    sVar9 = 0;
  }
  else {
    sVar9 = strlen(pcVar8);
  }
  path.Length = sVar9;
  path.Data = pcVar8;
  llbuild::buildsystem::BuildSystem::attachDB(&local_588,path,(string *)0x0);
  mainFilename.Length._0_4_ =
       local_360.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  mainFilename.Data =
       (char *)local_360.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  mainFilename.Length._4_4_ = 0;
  bVar5 = llbuild::buildsystem::BuildSystem::loadDescription(&local_588,mainFilename);
  local_558.character = bVar5;
  local_550.twine = (Twine *)0x0;
  if (bVar5) {
    local_380[0] = local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_380,local_448.key.key._M_dataplus._M_p,
               local_448.key.key._M_dataplus._M_p + local_448.key.key._M_string_length);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)&local_4d8,&local_588,
               (BuildKey *)local_380);
    if (local_380[0] != local_370) {
      operator_delete(local_380[0],local_370[0] + 1);
    }
    local_5a8[0] = (internal)local_468;
    pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_468 == '\0') {
      testing::Message::Message((Message *)&local_570);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_558,(internal *)local_5a8,(AssertionResult *)"result.hasValue()",
                 "false","true",in_R9);
      iVar6 = 0x3a8;
LAB_00131161:
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,iVar6,local_558.cString);
      testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_570);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558.twine != &local_548) {
        operator_delete(local_558.twine,local_548._M_allocated_capacity + 1);
      }
joined_r0x001311a3:
      if (local_570.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((local_570.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
    else {
      local_5a8[0] = (internal)(local_4d8.decUI == 7);
      pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_4d8.decUI != 7) {
        testing::Message::Message((Message *)&local_570);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_558,(internal *)local_5a8,
                   (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9)
        ;
        iVar6 = 0x3a9;
        goto LAB_00131161;
      }
      llbuild::buildsystem::BuildValue::getStaleFileList
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_558,
                 (BuildValue *)&local_4d8);
      local_570.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)local_550.twine - (long)local_558 >> 4);
      local_580.data_ = (AssertHelperData *)0x32;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_5a8,"result.getValue().getStaleFileList().size()","50UL",
                 (unsigned_long *)&local_570,(unsigned_long *)&local_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558.twine !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_558.twine,local_548._M_allocated_capacity - (long)local_558);
      }
      if (local_5a8[0] != (internal)0x0) {
        if (pbStack_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_5a0,pbStack_5a0);
        }
        if (local_468 == '\0') {
LAB_00131d53:
          __assert_fail("Storage.hasVal",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                        ,0xb0,
                        "T *llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer() [T = llbuild::buildsystem::BuildValue]"
                       );
        }
        llbuild::buildsystem::BuildValue::getStaleFileList
                  ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_558,
                   (BuildValue *)&local_4d8);
        sVar9 = local_4f0;
        CVar4 = local_4f8;
        CVar3 = local_550;
        local_460.twine = local_558.twine;
        if (local_558.twine == local_550.twine) {
          cVar14 = '\0';
        }
        else {
          cVar14 = '\0';
          CVar17 = local_558;
          do {
            if (((CVar17.stdString)->_M_string_length == sVar9) &&
               ((sVar9 == 0 ||
                (iVar6 = bcmp((void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)&(CVar17.smallString)->
                                           super_SmallVectorTemplateBase<char,_true>)->
                                      _M_allocated_capacity,CVar4.twine,sVar9), iVar6 == 0)))) {
              cVar14 = '\x01';
            }
            CVar17.twine = (Twine *)&(CVar17.twine)->LHSKind;
          } while (CVar17.twine != CVar3.twine);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460.twine !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_460.twine,local_548._M_allocated_capacity - (long)local_460);
        }
        local_5a8[0] = (internal)cVar14;
        pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (cVar14 != '\0') {
          local_558.twine = (Twine *)&local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,"commandPreparing(C.1)","");
          local_538._M_allocated_capacity = (size_type)local_528;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_538,"commandStarted(C.1)","");
          plVar15 = local_508;
          local_518[0] = plVar15;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_518,"commandFinished(C.1: 0)","");
          local_5a8 = (undefined1  [8])0x0;
          pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_598._M_allocated_capacity = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5a8,
                     &local_558,&local_4f8);
          llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                    (&local_570,(MockBuildSystemDelegate *)&local_428);
          testing::internal::
          CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((internal *)&local_580,
                     "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
                     ,"delegate.getMessages()",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5a8,&local_570);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_570);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5a8);
          lVar18 = -0x60;
          do {
            if (plVar15 != (long *)plVar15[-2]) {
              operator_delete((long *)plVar15[-2],*plVar15 + 1);
            }
            plVar15 = plVar15 + -4;
            lVar18 = lVar18 + 0x20;
          } while (lVar18 != 0);
          if (local_580.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_558);
            if (local_578 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = (local_578->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_5a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x3b9,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_5a8,(Message *)&local_558);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558.twine !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*local_558.decUL + 8))();
            }
            if (local_578 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_578;
              __ptr_00 = local_578;
LAB_00131a19:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(this_00,__ptr_00);
            }
LAB_00131a1e:
            if (local_468 == '\x01') {
              llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4d8);
            }
          }
          else {
            if (local_578 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_578,local_578);
            }
            if (local_468 == '\x01') {
              llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4d8);
            }
            llbuild::buildsystem::BuildSystem::~BuildSystem(&local_588);
            llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                      ((MockBuildSystemDelegate *)&local_428);
            local_4d8.decUI = 0;
            Filename_00.Length._0_4_ =
                 local_360.super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            Filename_00.Data =
                 (char *)local_360.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
            Filename_00.Length._4_4_ = 0;
            local_4d0 = lVar7;
            llvm::raw_fd_ostream::raw_fd_ostream
                      ((raw_fd_ostream *)&local_428,Filename_00,(error_code *)&local_4d8,F_Text);
            if (local_4d8.decUI != 0) {
              __assert_fail("!ec",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                            ,0x3bf,
                            "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                           );
            }
            Str_00.Length = 0xc1d;
            Str_00.Data = 
            "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-targe..." /* TRUNCATED STRING LITERAL */
            ;
            llvm::raw_ostream::operator<<((raw_ostream *)&local_428,Str_00);
            llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_428);
            llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
                      ((MockBuildSystemDelegate *)&local_428,true);
            llbuild::basic::createLocalFileSystem();
            llbuild::buildsystem::BuildSystem::BuildSystem
                      (&local_588,(BuildSystemDelegate *)&local_428,
                       (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                        *)&local_458);
            if (local_458._M_head_impl != (FileSystem *)0x0) {
              (*(local_458._M_head_impl)->_vptr_FileSystem[1])();
            }
            local_458._M_head_impl = (FileSystem *)0x0;
            pcVar8 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_250);
            if (pcVar8 == (char *)0x0) {
              sVar9 = 0;
            }
            else {
              sVar9 = strlen(pcVar8);
            }
            path_00.Length = sVar9;
            path_00.Data = pcVar8;
            llbuild::buildsystem::BuildSystem::attachDB(&local_588,path_00,(string *)0x0);
            mainFilename_00.Length._0_4_ =
                 local_360.super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            mainFilename_00.Data =
                 (char *)local_360.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
            mainFilename_00.Length._4_4_ = 0;
            bVar5 = llbuild::buildsystem::BuildSystem::loadDescription(&local_588,mainFilename_00);
            local_558.character = bVar5;
            local_550.twine = (Twine *)0x0;
            if (bVar5) {
              local_3a0[0] = local_390;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3a0,local_448.key.key._M_dataplus._M_p,
                         local_448.key.key._M_dataplus._M_p + local_448.key.key._M_string_length);
              llbuild::buildsystem::BuildSystem::build
                        ((Optional<llbuild::buildsystem::BuildValue> *)&local_4d8,&local_588,
                         (BuildKey *)local_3a0);
              if (local_3a0[0] != local_390) {
                operator_delete(local_3a0[0],local_390[0] + 1);
              }
              local_5a8[0] = (internal)local_468;
              pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              if (local_468 == '\0') {
                testing::Message::Message((Message *)&local_570);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&local_558,(internal *)local_5a8,
                           (AssertionResult *)"result.hasValue()","false","true",in_R9);
                iVar6 = 0x3d4;
LAB_001319c5:
                testing::internal::AssertHelper::AssertHelper
                          (&local_580,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                           ,iVar6,local_558.cString);
                testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_570);
                testing::internal::AssertHelper::~AssertHelper(&local_580);
                if (local_558.twine != (Twine *)&local_548) {
LAB_001319e5:
                  operator_delete(local_558.twine,local_548._M_allocated_capacity + 1);
                }
LAB_001319f2:
                if (local_570.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  (**(code **)(((local_570.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))
                            ();
                }
              }
              else {
                local_5a8[0] = (internal)(local_4d8.decUI == 7);
                pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                if (local_4d8.decUI != 7) {
                  testing::Message::Message((Message *)&local_570);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_558,(internal *)local_5a8,
                             (AssertionResult *)"result.getValue().isStaleFileRemoval()","false",
                             "true",in_R9);
                  iVar6 = 0x3d5;
                  goto LAB_001319c5;
                }
                llbuild::buildsystem::BuildValue::getStaleFileList
                          ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_558,
                           (BuildValue *)&local_4d8);
                local_570.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((long)local_550.twine - (long)local_558 >> 4);
                local_580.data_ = (AssertHelperData *)0x16;
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)local_5a8,"result.getValue().getStaleFileList().size()",
                           "22UL",(unsigned_long *)&local_570,(unsigned_long *)&local_580);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_558.twine !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_558.twine,local_548._M_allocated_capacity - (long)local_558)
                  ;
                }
                if (local_5a8[0] != (internal)0x0) {
                  if (pbStack_5a0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&pbStack_5a0,pbStack_5a0);
                  }
                  if (local_468 == '\0') goto LAB_00131d53;
                  llbuild::buildsystem::BuildValue::getStaleFileList
                            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_558
                             ,(BuildValue *)&local_4d8);
                  CVar17 = local_4f8;
                  CVar4 = local_550;
                  CVar3 = local_558;
                  if (local_558.twine == local_550.twine) {
                    cVar14 = '\0';
                  }
                  else {
                    cVar14 = '\0';
                    CVar13 = local_558;
                    do {
                      if (((CVar13.stdString)->_M_string_length == local_4f0) &&
                         ((local_4f0 == 0 ||
                          (iVar6 = bcmp((void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(CVar13.smallString)->
                                                     super_SmallVectorTemplateBase<char,_true>)->
                                                _M_allocated_capacity,CVar17.twine,local_4f0),
                          iVar6 == 0)))) {
                        cVar14 = '\x01';
                      }
                      CVar13.twine = (Twine *)&(CVar13.twine)->LHSKind;
                    } while (CVar13.twine != CVar4.twine);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CVar3.twine !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    operator_delete(CVar3.twine,local_548._M_allocated_capacity - (long)CVar3);
                  }
                  local_5a8[0] = (internal)cVar14;
                  pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                  if (cVar14 != '\0') {
                    llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                              (&local_570,(MockBuildSystemDelegate *)&local_428);
                    pbVar2 = local_570.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    pbVar1 = local_570.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_5a8,"cannot remove stale file \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_4f8);
                    puVar10 = (undefined8 *)std::__cxx11::string::append(local_5a8);
                    local_558.twine = (Twine *)&local_548;
                    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar10 == paVar12) {
                      local_548._M_allocated_capacity = paVar12->_M_allocated_capacity;
                      local_548._8_4_ = *(undefined4 *)(puVar10 + 3);
                      local_548._12_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
                    }
                    else {
                      local_548._M_allocated_capacity = paVar12->_M_allocated_capacity;
                      local_558.decUL = ((unsigned_long *)*puVar10).decUL;
                    }
                    local_550 = *(Child *)(puVar10 + 1);
                    *puVar10 = paVar12;
                    puVar10[1] = 0;
                    *(undefined1 *)(puVar10 + 2) = 0;
                    _Var11 = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (pbVar1,pbVar2,&local_558);
                    local_580.data_._0_1_ =
                         (internal)
                         (_Var11._M_current ==
                         local_570.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
                    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_558.twine != &local_548) {
                      operator_delete(local_558.twine,local_548._M_allocated_capacity + 1);
                    }
                    if (local_5a8 != (undefined1  [8])&local_598) {
                      operator_delete((void *)local_5a8,(ulong)(local_598._M_allocated_capacity + 1)
                                     );
                    }
                    if (_Var11._M_current !=
                        local_570.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      testing::Message::Message((Message *)local_5a8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&local_558,(internal *)&local_580,
                                 (AssertionResult *)
                                 "std::find(messages.begin(), messages.end(), \"cannot remove stale file \'\" + linkFileList + \"\': No such file or directory\") != messages.end()"
                                 ,"true","false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_3a8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                                 ,0x3e3,local_558.cString);
                      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_5a8);
                      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_558.twine != &local_548) {
                        operator_delete(local_558.twine,local_548._M_allocated_capacity + 1);
                      }
                      if (local_5a8 != (undefined1  [8])0x0) {
                        (**(code **)(*(size_type *)local_5a8 + 8))();
                      }
                      if (local_578 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_578,local_578);
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_570);
                    goto LAB_00131a1e;
                  }
                  testing::Message::Message((Message *)&local_570);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_558,(internal *)local_5a8,
                             (AssertionResult *)"hasLinkFileList","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_580,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                             ,0x3df,local_558.cString);
                  testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_570);
                  testing::internal::AssertHelper::~AssertHelper(&local_580);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_558.twine != &local_548) goto LAB_001319e5;
                  goto LAB_001319f2;
                }
                testing::Message::Message((Message *)&local_558);
                if (pbStack_5a0 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar16 = "";
                }
                else {
                  pcVar16 = (pbStack_5a0->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_570,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                           ,0x3d6,pcVar16);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_570,(Message *)&local_558);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_558.twine !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*local_558.decUL + 8))();
                }
              }
              if (pbStack_5a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&pbStack_5a0;
                __ptr_00 = pbStack_5a0;
                goto LAB_00131a19;
              }
              goto LAB_00131a1e;
            }
            testing::Message::Message((Message *)local_5a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_4d8,(internal *)&local_558.character,
                       (AssertionResult *)"loadingResult","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_570,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x3d1,(char *)CONCAT44(local_4d8._4_4_,local_4d8.decUI));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_570,(Message *)local_5a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
            if ((anon_union_80_2_ecfed234_for_valueData *)CONCAT44(local_4d8._4_4_,local_4d8.decUI)
                != &local_4c8) {
              operator_delete((anon_union_80_2_ecfed234_for_valueData *)
                              CONCAT44(local_4d8._4_4_,local_4d8.decUI),
                              (ulong)(local_4c8.asOutputInfo.device + 1));
            }
            if (local_5a8 != (undefined1  [8])0x0) {
              (**(code **)(*(size_type *)local_5a8 + 8))();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550.twine !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_550.character,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550.twine);
            }
          }
          llbuild::buildsystem::BuildSystem::~BuildSystem(&local_588);
          llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                    ((MockBuildSystemDelegate *)&local_428);
          goto LAB_00131212;
        }
        testing::Message::Message((Message *)&local_570);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_558,(internal *)local_5a8,(AssertionResult *)"hasLinkFileList",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_580,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3b3,local_558.cString);
        testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_570);
        testing::internal::AssertHelper::~AssertHelper(&local_580);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558.twine != &local_548) {
          operator_delete(local_558.twine,local_548._M_allocated_capacity + 1);
        }
        goto joined_r0x001311a3;
      }
      testing::Message::Message((Message *)&local_558);
      if (pbStack_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar16 = (pbStack_5a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_570,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3aa,pcVar16);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_570,(Message *)&local_558);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558.twine !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_558.decUL + 8))();
      }
    }
    if (pbStack_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_5a0,pbStack_5a0);
    }
    if (local_468 == '\x01') {
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_4d8,(internal *)&local_558.character,
               (AssertionResult *)"loadingResult","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_570,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x3a4,(char *)CONCAT44(local_4d8._4_4_,local_4d8.decUI));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_570,(Message *)local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
    if ((anon_union_80_2_ecfed234_for_valueData *)CONCAT44(local_4d8._4_4_,local_4d8.decUI) !=
        &local_4c8) {
      operator_delete((anon_union_80_2_ecfed234_for_valueData *)
                      CONCAT44(local_4d8._4_4_,local_4d8.decUI),
                      (ulong)(local_4c8.asOutputInfo.device + 1));
    }
    if (local_5a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_5a8 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550.twine !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_550.character,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_550.twine);
    }
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&local_588);
  local_428.twine = (Twine *)&PTR__MockBuildSystemDelegate_0024e788;
  llbuild::basic::ExecutionQueueDelegate::~ExecutionQueueDelegate(local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_3f8);
  llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate((BuildSystemDelegate *)&local_428)
  ;
LAB_00131212:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.twine != &local_4e8) {
    operator_delete(local_4f8.twine,local_4e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.twine != local_240) {
    free(local_250.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.key.key._M_dataplus._M_p != &local_448.key.key.field_2) {
    operator_delete(local_448.key.key._M_dataplus._M_p,
                    local_448.key.key.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)
      local_360.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_350) {
    free(local_360.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  llbuild::TmpDir::~TmpDir(&local_140);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemovalWithManyFiles) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Modules", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/module.modulemap"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  // We will check that the same file is present in both file lists, so it should not show up in the difference.
  std::string linkFileList = "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList";

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 50UL);

    // Check that `LinkFileList` is present in list of files of initial build
    bool hasLinkFileList = false;
    for (auto staleFile : result.getValue().getStaleFileList()) {
      if (staleFile == linkFileList) {
        hasLinkFileList = true;
      }
    }
    ASSERT_TRUE(hasLinkFileList);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, createLocalFileSystem());
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 22UL);

  // Check that `LinkFileList` is present in list of files of second build
  bool hasLinkFileList = false;
  for (auto staleFile : result.getValue().getStaleFileList()) {
    if (staleFile == linkFileList) {
      hasLinkFileList = true;
    }
  }
  ASSERT_TRUE(hasLinkFileList);

  // Check that `LinkFileList` is not present in the diff
  std::vector<std::string> messages = delegate.getMessages();
  ASSERT_FALSE(std::find(messages.begin(), messages.end(), "cannot remove stale file '" + linkFileList + "': No such file or directory") != messages.end());
}